

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timestamp.cpp
# Opt level: O3

string * __thiscall
sznet::Timestamp::toFormattedString_abi_cxx11_
          (string *__return_storage_ptr__,Timestamp *this,bool showMicroseconds)

{
  size_t sVar1;
  undefined7 in_register_00000011;
  char *__format;
  char acStack_88 [8];
  char buf [32];
  undefined1 local_60 [8];
  tm tm_time;
  
  acStack_88[0] = '\0';
  acStack_88[1] = '\0';
  acStack_88[2] = '\0';
  acStack_88[3] = '\0';
  acStack_88[4] = '\0';
  acStack_88[5] = '\0';
  acStack_88[6] = '\0';
  acStack_88[7] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  sz_localtime((tm *)local_60,this->m_microSecondsSinceEpoch / 1000000);
  if ((int)CONCAT71(in_register_00000011,showMicroseconds) == 0) {
    __format = "%4d%02d%02d %02d:%02d:%02d";
  }
  else {
    __format = "%4d%02d%02d %02d:%02d:%02d.%06d";
  }
  snprintf(acStack_88,0x20,__format,(ulong)(tm_time.tm_mday + 0x76c),(ulong)(tm_time.tm_hour + 1),
           (ulong)(uint)tm_time.tm_min,(ulong)(uint)tm_time.tm_sec,(ulong)(uint)local_60._4_4_,
           (ulong)(uint)local_60._0_4_);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_88);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_88,buf + (sVar1 - 8));
  return __return_storage_ptr__;
}

Assistant:

string Timestamp::toFormattedString(bool showMicroseconds) const
{
	char buf[32] = { 0 };
	time_t seconds = static_cast<time_t>(m_microSecondsSinceEpoch / kMicroSecondsPerSecond);
	struct tm tm_time;
	sz_localtime(tm_time, seconds);

	if (showMicroseconds)
	{
		int microseconds = static_cast<int>(m_microSecondsSinceEpoch % kMicroSecondsPerSecond);
		snprintf(buf, sizeof(buf), "%4d%02d%02d %02d:%02d:%02d.%06d",
			tm_time.tm_year + 1900, tm_time.tm_mon + 1, tm_time.tm_mday,
			tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec,
			microseconds);
	}
	else
	{
		snprintf(buf, sizeof(buf), "%4d%02d%02d %02d:%02d:%02d",
			tm_time.tm_year + 1900, tm_time.tm_mon + 1, tm_time.tm_mday,
			tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec);
	}

	return buf;
}